

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O2

void __thiscall
Atari2600::TIA::draw_object<Atari2600::TIA::Ball>
          (TIA *this,Ball *object,uint8_t collision_identity,int start,int end)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)this->horizontal_blank_extend_ * 8 + 0x40;
  if (start < (int)uVar2) {
    uVar1 = end;
    if ((int)uVar2 < end) {
      uVar1 = uVar2;
    }
    perform_border_motion<Atari2600::TIA::Ball>(this,object,start,uVar1);
  }
  if ((int)uVar2 <= end) {
    if ((int)uVar2 <= start) {
      uVar2 = start;
    }
    if (uVar2 < (uint)end) {
      if (start < 0xe0) {
        uVar1 = 0xa0;
        if (end - 0x40U < 0xa0) {
          uVar1 = end - 0x40U;
        }
        draw_object_visible<Atari2600::TIA::Ball>
                  (this,object,collision_identity,uVar2 - 0x40,uVar1,end + -0x44);
      }
      if (((0xdf < (uint)end) &&
          ((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving !=
           false)) &&
         ((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.motion_time <
          end)) {
        perform_motion_step<Atari2600::TIA::Ball>(this,object);
        return;
      }
    }
  }
  return;
}

Assistant:

void TIA::draw_object(T &object, const uint8_t collision_identity, int start, int end) {
	int first_pixel = first_pixel_cycle - 4 + (horizontal_blank_extend_ ? 8 : 0);

	object.dequeue_pixels(collision_buffer_, collision_identity, end - first_pixel_cycle);

	// movement works across the entire screen, so do work that falls outside of the pixel area
	if(start < first_pixel) {
		perform_border_motion<T>(object, start, std::min(end, first_pixel));
	}

	// don't continue to do any drawing if this window ends too early
	if(end < first_pixel) return;
	if(start < first_pixel) start = first_pixel;
	if(start >= end) return;

	// perform the visible part of the line, if any
	if(start < 224) {
		draw_object_visible<T>(object, collision_identity, start - first_pixel_cycle + 4, std::min(end - first_pixel_cycle + 4, 160), end - first_pixel_cycle);
	}

	// move further if required
	if(object.is_moving && end >= 224 && object.motion_time < end) {
		perform_motion_step<T>(object);
	}
}